

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  ulong *puVar1;
  pthread_mutex_t *bin;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  uint32_t uVar5;
  arena_t *arena;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  rtree_leaf_elm_t *prVar11;
  bin_info_t *bin_00;
  mutex_prof_data_t *data;
  long lVar12;
  pthread_mutex_t *tsdn_00;
  arena_t *arena_00;
  pthread_mutex_t *__mutex;
  ulong uVar13;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (ulong)ptr & 0xffffffffc0000000;
  uVar13 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar13);
  uVar13 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar13);
  if (uVar13 == uVar10) {
    prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar10) {
    prVar11 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar13;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar10;
    puVar1[1] = (ulong)prVar11;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(prVar11->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar12 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar12 + -8) == uVar10) {
        uVar6 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar12);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar12 + -0x18);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar12 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        *(ulong *)((long)ctx->cache + lVar12 + -0x18) = uVar13;
        *(ulong *)((long)(ctx->cache + -1) + lVar12) = puVar1[1];
        *puVar1 = uVar10;
        puVar1[1] = uVar6;
        prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar6);
        goto LAB_00cdd0ed;
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x188);
    prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                        (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_00cdd0ed:
  arena_00 = (arena_t *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  uVar13 = *(ulong *)arena_00->nthreads;
  arena = (arena_t *)duckdb_je_arenas[(uint)uVar13 & 0xfff].repr;
  uVar10 = uVar13 >> 0x14 & 0xff;
  uVar8 = (uint)(uVar13 >> 0x26) & 0x3f;
  uVar13 = (ulong)(uVar8 << 8);
  if ((uint)uVar10 < duckdb_je_bin_info_nbatched_sizes) {
    uVar13 = (ulong)uVar8 * 0x288;
  }
  bin = (pthread_mutex_t *)
        ((long)&arena->nthreads[0].repr + uVar13 + duckdb_je_arena_bin_offsets[uVar10]);
  __mutex = (pthread_mutex_t *)
            ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr +
            uVar13 + duckdb_je_arena_bin_offsets[uVar10]);
  tsdn_00 = __mutex;
  iVar9 = pthread_mutex_trylock(__mutex);
  if (iVar9 != 0) {
    tsdn_00 = bin;
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&bin->__data);
    *(undefined1 *)((long)bin + 0x40) = 1;
  }
  *(long *)((long)bin + 0x38) = *(long *)((long)bin + 0x38) + 1;
  if (*(tsdn_t **)((long)bin + 0x30) != tsdn) {
    *(tsdn_t **)((long)bin + 0x30) = tsdn;
    bin[1].__align = bin[1].__align + 1;
  }
  uVar13 = ((long)ptr - *(long *)&arena_00->binshard_next) *
           (ulong)duckdb_je_arena_binind_div_info[uVar10].magic;
  *(ulong *)(arena_00->nthreads + (uVar13 >> 0x26) * 2 + 0x10) =
       *(ulong *)(arena_00->nthreads + (uVar13 >> 0x26) * 2 + 0x10) ^
       1L << ((byte)(uVar13 >> 0x20) & 0x3f);
  uVar13 = *(long *)arena_00->nthreads + 0x10000000;
  *(ulong *)arena_00->nthreads = uVar13;
  uVar8 = (uint)(uVar13 >> 0x1c) & 0x3ff;
  bin_00 = duckdb_je_bin_infos;
  uVar5 = duckdb_je_bin_infos[uVar10].nregs;
  if (uVar8 == uVar5) {
    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
              ((tsdn_t *)&tsdn_00->__data,arena,(edata_t *)arena_00,(bin_t *)&bin->__data);
  }
  else if ((uVar8 == 1) && (*(arena_t **)((long)bin + 0xe0) != arena_00)) {
    arena_bin_slabs_full_remove
              ((arena_t *)(ulong)arena->ind,(bin_t *)&bin->__data,(edata_t *)arena_00);
    arena_bin_lower_slab((tsdn_t *)arena,arena_00,(edata_t *)&bin->__data,(bin_t *)bin_00);
  }
  bin[3].__align = bin[3].__align + 1;
  *(size_t *)((long)bin + 0x88) = *(size_t *)((long)bin + 0x88) - 1;
  *(undefined1 *)((long)bin + 0x40) = 0;
  pthread_mutex_unlock(__mutex);
  if (uVar8 == uVar5) {
    duckdb_je_arena_slab_dalloc(tsdn,arena,(edata_t *)arena_00);
  }
  if (tsdn != (tsdn_t *)0x0) {
    cVar4 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar9 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar9 + -1;
    if (iVar9 < 1) {
      if (cVar4 < '\x01') {
        uVar13 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar13;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar13 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
      }
      else {
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             0;
      }
    }
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	arena_t *arena = arena_get_from_edata(edata);

	arena_dalloc_bin(tsdn, arena, edata, ptr);
	arena_decay_tick(tsdn, arena);
}